

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O2

void proto3_unittest::NestedTestAllTypes::SharedDtor(MessageLite *self)

{
  NestedTestAllTypes *this;
  TestAllTypes *this_00;
  ulong uVar1;
  LogMessageFatal local_20;
  
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this = (NestedTestAllTypes *)self[1]._internal_metadata_.ptr_;
    if (this != (NestedTestAllTypes *)0x0) {
      ~NestedTestAllTypes(this);
    }
    operator_delete(this,0x28);
    this_00 = (TestAllTypes *)self[2]._vptr_MessageLite;
    if (this_00 != (TestAllTypes *)0x0) {
      proto3_unittest::TestAllTypes::~TestAllTypes(this_00);
    }
    operator_delete(this_00,0x2c8);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_proto3.pb.cc"
             ,0x11b7,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void NestedTestAllTypes::SharedDtor(MessageLite& self) {
  NestedTestAllTypes& this_ = static_cast<NestedTestAllTypes&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.child_;
  delete this_._impl_.payload_;
  this_._impl_.~Impl_();
}